

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

uint __thiscall ON_MeshNgonIterator::Count(ON_MeshNgonIterator *this)

{
  uint *puVar1;
  ON_Mesh *pOVar2;
  ON_MeshNgon **ppOVar3;
  ON_MeshNgon *pOVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  
  pOVar2 = this->m_mesh;
  if (pOVar2 == (ON_Mesh *)0x0) {
LAB_00532d75:
    uVar6 = 0;
  }
  else {
    uVar6 = (pOVar2->m_F).m_count;
    uVar7 = (pOVar2->m_Ngon).m_count;
    if (uVar7 == 0) {
      return uVar6;
    }
    ppOVar3 = (pOVar2->m_Ngon).m_a;
    if (ppOVar3 != (ON_MeshNgon **)0x0) {
      bVar9 = true;
      uVar8 = 0;
      do {
        pOVar4 = ppOVar3[uVar8];
        if (pOVar4 == (ON_MeshNgon *)0x0) {
          uVar7 = uVar7 - 1;
          bVar5 = true;
        }
        else {
          puVar1 = &pOVar4->m_Fcount;
          if (uVar6 < *puVar1) {
            bVar5 = false;
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh_ngon.cpp"
                       ,0x15c7,"","Invalid ngon information on mesh");
          }
          else {
            bVar5 = true;
            uVar6 = uVar6 - *puVar1;
          }
        }
        if (!bVar5) break;
        uVar8 = uVar8 + 1;
        bVar9 = uVar8 < uVar7;
      } while (bVar9);
      if (bVar9) goto LAB_00532d75;
    }
    uVar6 = uVar6 + uVar7;
  }
  return uVar6;
}

Assistant:

unsigned int ON_MeshNgonIterator::Count() const
{
	unsigned int count = 0;

  if (nullptr != m_mesh)
  {
    count = m_mesh->m_F.UnsignedCount();
    unsigned int explicit_ngon_count = m_mesh->NgonUnsignedCount();
    if (explicit_ngon_count > 0)
    {
      // subtract the number of mesh faces that are in explicit ngons from count.
      const ON_MeshNgon* const * ngons = m_mesh->Ngons();
      if (nullptr != ngons)
      {
        for (unsigned int ni = 0; ni < explicit_ngon_count; ni++)
        {
          const ON_MeshNgon* ngon = ngons[ni];
          if (nullptr == ngon)
            explicit_ngon_count--;
          else if (ngon->m_Fcount <= count)
            count -= ngon->m_Fcount;
          else
          {
            ON_ERROR("Invalid ngon information on mesh");
            return 0;
          }
        }
      }

      // add the number of explicit ngons to count
      count += explicit_ngon_count;
    }
  }

  // return the number of explicit ngons + the number of faces that are not in an explicit ngon.
	return count;
}